

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixEigenExtensions.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::ArchiveIN
          (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this,ChArchiveIn *marchive)

{
  long lVar1;
  long lVar2;
  size_t i;
  ulong index;
  size_t tot_elements;
  size_t m_col;
  size_t m_row;
  char idname [20];
  ChNameValue<double> local_a0;
  unsigned_long local_88;
  unsigned_long local_80;
  char local_78 [24];
  ChNameValue<unsigned_long> local_60;
  ChNameValue<unsigned_long> local_48;
  
  chrono::ChArchiveIn::VersionRead<chrono::ChMatrix_dense_version_tag>(marchive);
  local_48._value = &local_80;
  local_48._name = "rows";
  local_48._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &local_88;
  local_60._name = "columns";
  local_60._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_60);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this,local_80,local_88);
  lVar1 = *(long *)(this + 0x10);
  lVar2 = *(long *)(this + 8);
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xe])(marchive,"data");
  for (index = 0; index < (ulong)(lVar1 * lVar2); index = index + 1) {
    sprintf(local_78,"%lu",index);
    local_a0._value =
         DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                   ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this,index);
    local_a0._flags = '\0';
    local_a0._name = local_78;
    chrono::ChArchiveIn::operator>>(marchive,&local_a0);
    (*(marchive->super_ChArchive)._vptr_ChArchive[0xf])(marchive,"data");
  }
  (*(marchive->super_ChArchive)._vptr_ChArchive[0x10])(marchive,"data");
  return;
}

Assistant:

void ArchiveIN(chrono::ChArchiveIn& marchive) {
    // suggested: use versioning
    /*int version =*/ marchive.VersionRead<chrono::ChMatrix_dense_version_tag>(); // btw use the ChMatrixDynamic version tag also for all other templates.
	
    // stream in all member data
    size_t m_row; 
	size_t m_col;
    marchive >> chrono::make_ChNameValue("rows", m_row);
    marchive >> chrono::make_ChNameValue("columns", m_col);
	
    derived().resize(m_row, m_col);

    // custom input of matrix data as array
    size_t tot_elements = derived().rows() * derived().cols();
    marchive.in_array_pre("data", tot_elements);
	char idname[20]; // only for xml, xml serialization needs unique element name
    for (size_t i = 0; i < tot_elements; i++) {
		sprintf(idname, "%lu", (unsigned long)i);
        marchive >> chrono::CHNVP(derived()((Eigen::Index)i), idname);
        marchive.in_array_between("data");
    }
    marchive.in_array_end("data");
}